

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate.c
# Opt level: O0

void rdqk21(integr_fn *f,void *ex,double *a,double *b,double *result,double *abserr,double *resabs,
           double *resasc)

{
  double dVar1;
  int iVar2;
  double *in_RCX;
  double *in_RDX;
  undefined8 in_RSI;
  code *in_RDI;
  double *in_R8;
  double *in_R9;
  double dVar3;
  double dVar4;
  double *in_stack_00000008;
  double *in_stack_00000010;
  int jtwm1;
  int jtw;
  int j;
  double dhlgth;
  double epmach;
  double fc;
  double uflow;
  double reskh;
  double centr;
  double hlgth;
  double fval2;
  double fval1;
  double fsum;
  double resk;
  double resg;
  double absc;
  double vec [21];
  double fv2 [10];
  double fv1 [10];
  double local_218;
  double local_210;
  int local_1f4;
  double local_1a0;
  double local_198;
  double local_188 [22];
  double adStack_d8 [21];
  double *local_30;
  double *local_28;
  
  local_188[0] = (*in_RDX + *in_RCX) * 0.5;
  dVar3 = (*in_RCX - *in_RDX) * 0.5;
  local_198 = 0.0;
  for (local_1f4 = 1; local_1f4 < 6; local_1f4 = local_1f4 + 1) {
    dVar4 = rdqk21::xgk[local_1f4 * 2 + -1];
    local_188[local_1f4 * 2 + -1] = local_188[0] - dVar3 * dVar4;
    local_188[local_1f4 << 1] = local_188[0] + dVar3 * dVar4;
  }
  for (local_1f4 = 1; local_1f4 < 6; local_1f4 = local_1f4 + 1) {
    dVar4 = rdqk21::xgk[local_1f4 * 2 + -2];
    local_188[local_1f4 * 2 + 9] = local_188[0] - dVar3 * dVar4;
    local_188[local_1f4 * 2 + 10] = local_188[0] + dVar3 * dVar4;
  }
  local_30 = in_R9;
  local_28 = in_R8;
  (*in_RDI)(local_188,0x15,in_RSI);
  local_1a0 = rdqk21::wgk[10] * local_188[0];
  *in_stack_00000008 = ABS(local_1a0);
  for (local_1f4 = 1; local_1f4 < 6; local_1f4 = local_1f4 + 1) {
    iVar2 = local_1f4 * 2;
    dVar4 = local_188[local_1f4 * 2 + -1];
    dVar1 = local_188[local_1f4 << 1];
    adStack_d8[(long)(iVar2 + -1) + 10] = dVar4;
    adStack_d8[iVar2 + -1] = dVar1;
    local_198 = rdqk21::wg[local_1f4 + -1] * (dVar4 + dVar1) + local_198;
    local_1a0 = rdqk21::wgk[iVar2 + -1] * (dVar4 + dVar1) + local_1a0;
    *in_stack_00000008 = rdqk21::wgk[iVar2 + -1] * (ABS(dVar4) + ABS(dVar1)) + *in_stack_00000008;
  }
  for (local_1f4 = 1; local_1f4 < 6; local_1f4 = local_1f4 + 1) {
    iVar2 = local_1f4 * 2;
    dVar4 = local_188[local_1f4 * 2 + 9];
    dVar1 = local_188[local_1f4 * 2 + 10];
    adStack_d8[(long)(iVar2 + -2) + 10] = dVar4;
    adStack_d8[iVar2 + -2] = dVar1;
    local_1a0 = rdqk21::wgk[iVar2 + -2] * (dVar4 + dVar1) + local_1a0;
    *in_stack_00000008 = rdqk21::wgk[iVar2 + -2] * (ABS(dVar4) + ABS(dVar1)) + *in_stack_00000008;
  }
  dVar4 = local_1a0 * 0.5;
  *in_stack_00000010 = rdqk21::wgk[10] * ABS(local_188[0] - dVar4);
  for (local_1f4 = 1; local_1f4 < 0xb; local_1f4 = local_1f4 + 1) {
    *in_stack_00000010 =
         rdqk21::wgk[local_1f4 + -1] *
         (ABS(adStack_d8[(long)(local_1f4 + -1) + 10] - dVar4) +
         ABS(adStack_d8[local_1f4 + -1] - dVar4)) + *in_stack_00000010;
  }
  *local_28 = local_1a0 * dVar3;
  *in_stack_00000008 = ABS(dVar3) * *in_stack_00000008;
  *in_stack_00000010 = ABS(dVar3) * *in_stack_00000010;
  *local_30 = ABS((local_1a0 - local_198) * dVar3);
  if (((*in_stack_00000010 != 0.0) || (NAN(*in_stack_00000010))) &&
     ((*local_30 != 0.0 || (NAN(*local_30))))) {
    dVar3 = *in_stack_00000010;
    dVar4 = pow((*local_30 * 200.0) / *in_stack_00000010,1.5);
    if (dVar4 <= 1.0) {
      local_210 = pow((*local_30 * 200.0) / *in_stack_00000010,1.5);
    }
    else {
      local_210 = 1.0;
    }
    *local_30 = dVar3 * local_210;
  }
  if (2.0041683600089728e-294 < *in_stack_00000008) {
    if (*local_30 <= *in_stack_00000008 * 1.1102230246251565e-14) {
      local_218 = *in_stack_00000008 * 1.1102230246251565e-14;
    }
    else {
      local_218 = *local_30;
    }
    *local_30 = local_218;
  }
  return;
}

Assistant:

GPU_FUNCTION static void  rdqk21(integr_fn f, void *ex, double *a, double *b, double *result,
		    double *abserr, double *resabs, double *resasc)
{
  /* Initialized data */

  static double wg[5] = { .066671344308688137593568809893332,
			  .149451349150580593145776339657697,
			  .219086362515982043995534934228163,
			  .269266719309996355091226921569469,
			  .295524224714752870173892994651338 };
  static double xgk[11] = { .995657163025808080735527280689003,
			    .973906528517171720077964012084452,
			    .930157491355708226001207180059508,
			    .865063366688984510732096688423493,
			    .780817726586416897063717578345042,
			    .679409568299024406234327365114874,
			    .562757134668604683339000099272694,
			    .433395394129247190799265943165784,
			    .294392862701460198131126603103866,
			    .14887433898163121088482600112972,0. };
  static double wgk[11] = { .011694638867371874278064396062192,
			    .03255816230796472747881897245939,
			    .05475589657435199603138130024458,
			    .07503967481091995276704314091619,
			    .093125454583697605535065465083366,
			    .109387158802297641899210590325805,
			    .123491976262065851077958109831074,
			    .134709217311473325928054001771707,
			    .142775938577060080797094273138717,
			    .147739104901338491374841515972068,
			    .149445554002916905664936468389821 };


  /* Local variables */
  double fv1[10], fv2[10], vec[21];
  double absc, resg, resk, fsum, fval1, fval2;
  double hlgth, centr, reskh, uflow;
  double fc, epmach, dhlgth;
  int j, jtw, jtwm1;

/* ***begin prologue  dqk21
***date written   800101   (yymmdd)
***revision date  830518   (yymmdd)
***category no.  h2a1a2
***keywords  21-point gauss-kronrod rules
***author  piessens,robert,appl. math. & progr. div. - k.u.leuven
          de doncker,elise,appl. math. & progr. div. - k.u.leuven
***purpose  to compute i = integral of f over (a,b), with error
                          estimate
                      j = integral of abs(f) over (a,b)
***description

          integration rules
          standard fortran subroutine
          double precision version

          parameters
           on entry
             f      - double precision
                      function subprogram defining the integrand
                      function f(x). the actual name for f needs to be
                      declared e x t e r n a l in the driver program.

             a      - double precision
                      lower limit of integration

             b      - double precision
                      upper limit of integration

           on return
             result - double precision
                      approximation to the integral i
                      result is computed by applying the 21-point
                      kronrod rule (resk) obtained by optimal addition
                      of abscissae to the 10-point gauss rule (resg).

             abserr - double precision
                      estimate of the modulus of the absolute error,
                      which should not exceed abs(i-result)

             resabs - double precision
                      approximation to the integral j

             resasc - double precision
                      approximation to the integral of abs(f-i/(b-a))
                      over (a,b)

***references  (none)
***end prologue  dqk21



          the abscissae and weights are given for the interval (-1,1).
          because of symmetry only the positive abscissae and their
          corresponding weights are given.

          xgk    - abscissae of the 21-point kronrod rule
                   xgk(2), xgk(4), ...  abscissae of the 10-point
                   gauss rule
                   xgk(1), xgk(3), ...  abscissae which are optimally
                   added to the 10-point gauss rule

          wgk    - weights of the 21-point kronrod rule

          wg     - weights of the 10-point gauss rule


gauss quadrature weights and kronron quadrature abscissae and weights
as evaluated with 80 decimal digit arithmetic by l. w. fullerton,
bell labs, nov. 1981.





          list of major variables
          -----------------------

          centr  - mid point of the interval
          hlgth  - half-length of the interval
          absc   - abscissa
          fval*  - function value
          resg   - result of the 10-point gauss formula
          resk   - result of the 21-point kronrod formula
          reskh  - approximation to the mean value of f over (a,b),
                   i.e. to i/(b-a)


          machine dependent constants
          ---------------------------

          epmach is the largest relative spacing.
          uflow is the smallest positive magnitude. */

/* ***first executable statement  dqk21 */
  epmach = DBL_EPSILON;
  uflow = DBL_MIN;

  centr = (*a + *b) * .5;
  hlgth = (*b - *a) * .5;
  dhlgth = fabs(hlgth);

  /*           compute the 21-point kronrod approximation to
	       the integral, and estimate the absolute error. */

  resg = 0.;
  vec[0] = centr;
  for (j = 1; j <= 5; ++j) {
    jtw = j << 1;
    absc = hlgth * xgk[jtw - 1];
    vec[(j << 1) - 1] = centr - absc;
    /* L5: */
    vec[j * 2] = centr + absc;
  }
  for (j = 1; j <= 5; ++j) {
    jtwm1 = (j << 1) - 1;
    absc = hlgth * xgk[jtwm1 - 1];
    vec[(j << 1) + 9] = centr - absc;
    vec[(j << 1) + 10] = centr + absc;
  }
  f(vec, 21, ex);
  fc = vec[0];
  resk = wgk[10] * fc;
  *resabs = fabs(resk);
  for (j = 1; j <= 5; ++j) {
    jtw = j << 1;
    absc = hlgth * xgk[jtw - 1];
    fval1 = vec[(j << 1) - 1];
    fval2 = vec[j * 2];
    fv1[jtw - 1] = fval1;
    fv2[jtw - 1] = fval2;
    fsum = fval1 + fval2;
    resg += wg[j - 1] * fsum;
    resk += wgk[jtw - 1] * fsum;
    *resabs += wgk[jtw - 1] * (fabs(fval1) + fabs(fval2));
    /* L10: */
  }
  for (j = 1; j <= 5; ++j) {
    jtwm1 = (j << 1) - 1;
    absc = hlgth * xgk[jtwm1 - 1];
    fval1 = vec[(j << 1) + 9];
    fval2 = vec[(j << 1) + 10];
    fv1[jtwm1 - 1] = fval1;
    fv2[jtwm1 - 1] = fval2;
    fsum = fval1 + fval2;
    resk += wgk[jtwm1 - 1] * fsum;
    *resabs += wgk[jtwm1 - 1] * (fabs(fval1) + fabs(fval2));
    /* L15: */
  }
  reskh = resk * .5;
  *resasc = wgk[10] * fabs(fc - reskh);
  for (j = 1; j <= 10; ++j) {
    *resasc += wgk[j - 1] * (fabs(fv1[j - 1] - reskh) +
			     fabs(fv2[j - 1] - reskh));
    /* L20: */
  }
  *result = resk * hlgth;
  *resabs *= dhlgth;
  *resasc *= dhlgth;
  *abserr = fabs((resk - resg) * hlgth);
  if (*resasc != 0. && *abserr != 0.) {
    *abserr = *resasc * m_min(1., pow(*abserr * 200. / *resasc, 1.5));
  }
  if (*resabs > uflow / (epmach * 50.)) {
    *abserr = m_max(epmach * 50. * *resabs, *abserr);
  }
  return;
}